

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  __m128 _outp_5;
  __m128 _b_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_512_1;
  __m256 _p_256;
  __m128 _p_2;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_512;
  __m256 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_add op;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  int local_a44;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  int local_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  int local_7f8;
  undefined8 *local_7e8;
  float *local_7e0;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  local_7e8 = in_RDX;
  local_7e0 = in_RSI;
  if (in_R8D == 0x10) {
    local_7f8 = 0;
    auVar15 = *in_RDI;
    for (; local_7f8 < in_ECX; local_7f8 = local_7f8 + 1) {
      auVar14 = vbroadcastss_avx512f(ZEXT416((uint)*local_7e0));
      auVar14 = vaddps_avx512f(auVar15,auVar14);
      local_8c0 = auVar14._0_8_;
      uStack_8b8 = auVar14._8_8_;
      uStack_8b0 = auVar14._16_8_;
      uStack_8a8 = auVar14._24_8_;
      uStack_8a0 = auVar14._32_8_;
      uStack_898 = auVar14._40_8_;
      uStack_890 = auVar14._48_8_;
      uStack_888 = auVar14._56_8_;
      *local_7e8 = local_8c0;
      local_7e8[1] = uStack_8b8;
      local_7e8[2] = uStack_8b0;
      local_7e8[3] = uStack_8a8;
      local_7e8[4] = uStack_8a0;
      local_7e8[5] = uStack_898;
      local_7e8[6] = uStack_890;
      local_7e8[7] = uStack_888;
      local_7e0 = local_7e0 + 1;
      local_7e8 = local_7e8 + 8;
    }
  }
  if (in_R8D == 8) {
    local_8c4 = 0;
    uVar7 = *(undefined8 *)*in_RDI;
    uVar8 = *(undefined8 *)(*in_RDI + 8);
    uVar9 = *(undefined8 *)(*in_RDI + 0x10);
    uVar10 = *(undefined8 *)(*in_RDI + 0x18);
    auVar15 = vinsertf64x4_avx512f
                        (ZEXT3264(*(undefined1 (*) [32])*in_RDI),*(undefined1 (*) [32])*in_RDI,1);
    for (; local_8c4 + 1 < in_ECX; local_8c4 = local_8c4 + 2) {
      fVar1 = *local_7e0;
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
      uStack_110 = auVar5._0_8_;
      uStack_108 = auVar5._8_8_;
      fVar1 = local_7e0[1];
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar1),0x30);
      uStack_d0 = auVar6._0_8_;
      uStack_c8 = auVar6._8_8_;
      auVar13._16_8_ = uStack_d0;
      auVar13._0_16_ = auVar5;
      auVar13._24_8_ = uStack_c8;
      auVar14 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(uStack_108,CONCAT816(uStack_110,auVar4))),auVar13,1);
      auVar14 = vaddps_avx512f(auVar15,auVar14);
      local_a00 = auVar14._0_8_;
      uStack_9f8 = auVar14._8_8_;
      uStack_9f0 = auVar14._16_8_;
      uStack_9e8 = auVar14._24_8_;
      uStack_9e0 = auVar14._32_8_;
      uStack_9d8 = auVar14._40_8_;
      uStack_9d0 = auVar14._48_8_;
      uStack_9c8 = auVar14._56_8_;
      *local_7e8 = local_a00;
      local_7e8[1] = uStack_9f8;
      local_7e8[2] = uStack_9f0;
      local_7e8[3] = uStack_9e8;
      local_7e8[4] = uStack_9e0;
      local_7e8[5] = uStack_9d8;
      local_7e8[6] = uStack_9d0;
      local_7e8[7] = uStack_9c8;
      local_7e0 = local_7e0 + 2;
      local_7e8 = local_7e8 + 8;
    }
    for (; local_8c4 < in_ECX; local_8c4 = local_8c4 + 1) {
      fVar1 = *local_7e0;
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
      local_3a0 = (float)uVar7;
      fStack_39c = (float)((ulong)uVar7 >> 0x20);
      fStack_398 = (float)uVar8;
      fStack_394 = (float)((ulong)uVar8 >> 0x20);
      fStack_390 = (float)uVar9;
      fStack_38c = (float)((ulong)uVar9 >> 0x20);
      fStack_388 = (float)uVar10;
      fStack_384 = (float)((ulong)uVar10 >> 0x20);
      local_3c0 = auVar5._0_4_;
      fStack_3bc = auVar5._4_4_;
      fStack_3b8 = auVar5._8_4_;
      fStack_3b4 = auVar5._12_4_;
      fStack_3b0 = auVar4._0_4_;
      fStack_3ac = auVar4._4_4_;
      fStack_3a8 = auVar4._8_4_;
      fStack_3a4 = auVar4._12_4_;
      *local_7e8 = CONCAT44(fStack_39c + fStack_3bc,local_3a0 + local_3c0);
      local_7e8[1] = CONCAT44(fStack_394 + fStack_3b4,fStack_398 + fStack_3b8);
      local_7e8[2] = CONCAT44(fStack_38c + fStack_3ac,fStack_390 + fStack_3b0);
      local_7e8[3] = CONCAT44(fStack_384 + fStack_3a4,fStack_388 + fStack_3a8);
      local_7e0 = local_7e0 + 1;
      local_7e8 = local_7e8 + 4;
    }
  }
  if (in_R8D == 4) {
    local_a44 = 0;
    uVar7 = *(undefined8 *)*in_RDI;
    uVar8 = *(undefined8 *)(*in_RDI + 8);
    auVar12._16_8_ = uVar7;
    auVar12._0_16_ = *(undefined1 (*) [16])*in_RDI;
    auVar12._24_8_ = uVar8;
    auVar15 = vinsertf64x4_avx512f
                        (ZEXT3264(CONCAT824(uVar8,CONCAT816(uVar7,*(undefined1 (*) [16])*in_RDI))),
                         auVar12,1);
    for (; local_a44 + 3 < in_ECX; local_a44 = local_a44 + 4) {
      fVar1 = *local_7e0;
      fVar2 = local_7e0[1];
      fVar3 = local_7e0[2];
      auVar11._4_4_ = fVar3;
      auVar11._0_4_ = fVar3;
      auVar11._12_4_ = fVar3;
      auVar11._8_4_ = fVar3;
      fVar3 = local_7e0[3];
      auVar11._20_4_ = fVar3;
      auVar11._16_4_ = fVar3;
      auVar11._28_4_ = fVar3;
      auVar11._24_4_ = fVar3;
      auVar14 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(CONCAT44(fVar2,fVar2),
                                              CONCAT816(CONCAT44(fVar2,fVar2),
                                                        CONCAT88(CONCAT44(fVar1,fVar1),
                                                                 CONCAT44(fVar1,fVar1))))),auVar11,1
                          );
      auVar14 = vaddps_avx512f(auVar15,auVar14);
      local_bc0 = auVar14._0_8_;
      uStack_bb8 = auVar14._8_8_;
      uStack_bb0 = auVar14._16_8_;
      uStack_ba8 = auVar14._24_8_;
      uStack_ba0 = auVar14._32_8_;
      uStack_b98 = auVar14._40_8_;
      uStack_b90 = auVar14._48_8_;
      uStack_b88 = auVar14._56_8_;
      *local_7e8 = local_bc0;
      local_7e8[1] = uStack_bb8;
      local_7e8[2] = uStack_bb0;
      local_7e8[3] = uStack_ba8;
      local_7e8[4] = uStack_ba0;
      local_7e8[5] = uStack_b98;
      local_7e8[6] = uStack_b90;
      local_7e8[7] = uStack_b88;
      local_7e0 = local_7e0 + 4;
      local_7e8 = local_7e8 + 8;
    }
    while( true ) {
      local_360 = (float)uVar7;
      fStack_35c = (float)((ulong)uVar7 >> 0x20);
      fStack_358 = (float)uVar8;
      fStack_354 = (float)((ulong)uVar8 >> 0x20);
      if (in_ECX <= local_a44 + 1) break;
      fVar1 = *local_7e0;
      fVar2 = local_7e0[1];
      *local_7e8 = CONCAT44(fStack_35c + fVar1,local_360 + fVar1);
      local_7e8[1] = CONCAT44(fStack_354 + fVar1,fStack_358 + fVar1);
      local_7e8[2] = CONCAT44(fStack_35c + fVar2,local_360 + fVar2);
      local_7e8[3] = CONCAT44(fStack_354 + fVar2,fStack_358 + fVar2);
      local_7e0 = local_7e0 + 2;
      local_7e8 = local_7e8 + 4;
      local_a44 = local_a44 + 2;
    }
    for (; local_a44 < in_ECX; local_a44 = local_a44 + 1) {
      fVar1 = *local_7e0;
      *local_7e8 = CONCAT44(fStack_35c + fVar1,local_360 + fVar1);
      local_7e8[1] = CONCAT44(fStack_354 + fVar1,fStack_358 + fVar1);
      local_7e0 = local_7e0 + 1;
      local_7e8 = local_7e8 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}